

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void __thiscall
HistoryBuffer::ReadBuffer
          (HistoryBuffer *this,float *buffer,int numsamplesTarget,int numsamplesSource,float offset)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar1 = numsamplesTarget - 1;
  fVar10 = 0.0;
  if (1 < numsamplesTarget) {
    iVar3 = this->writeindex;
    pfVar4 = this->data;
    lVar8 = 0;
    do {
      fVar10 = (float)iVar3 - offset;
      iVar6 = this->length;
      fVar11 = (float)iVar6;
      fVar10 = (float)(-(uint)(fVar10 < 0.0) & (uint)(fVar10 + fVar11) |
                      ~-(uint)(fVar10 < 0.0) & (uint)fVar10);
      fVar9 = floorf(fVar10);
      iVar5 = (int)fVar9;
      if (iVar5 != 0) {
        iVar6 = iVar5;
      }
      fVar2 = pfVar4[(long)iVar6 + -1];
      buffer[numsamplesTarget + -2 + (int)lVar8] =
           (fVar10 - (float)(int)fVar9) * (pfVar4[iVar5] - fVar2) + fVar2;
      offset = offset + (float)numsamplesSource / (float)(int)uVar1;
      if (fVar11 <= offset) {
        uVar7 = -(int)lVar8;
        break;
      }
      lVar8 = lVar8 + -1;
      uVar7 = uVar1;
    } while (-lVar8 != (ulong)uVar1);
    fVar10 = (float)(int)uVar7;
  }
  buffer[(int)uVar1] = fVar10;
  return;
}

Assistant:

void HistoryBuffer::ReadBuffer(float* buffer, int numsamplesTarget, int numsamplesSource, float offset)
{
    numsamplesTarget--; // reserve last sample for count of how much we were able to read
    float speed = (float)numsamplesSource / (float)numsamplesTarget;
    int n, w = writeindex; // since ReadBuffer is called from the GUI thread, writeindex may be modified by the DSP thread simultaneously
    float p = offset;
    for (n = 0; n < numsamplesTarget; n++)
    {
        float f = w - p;
        if (f < 0.0f)
            f += length;
        int i = FastFloor(f);
        float s1 = data[(i == 0) ? (length - 1) : (i - 1)];
        float s2 = data[i];
        buffer[numsamplesTarget - 1 - n] = s1 + (s2 - s1) * (f - i);
        p += speed;
        if (p >= length)
            break;
    }
    buffer[numsamplesTarget] = (float)n; // how many samples were written
}